

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int tiologopn(tiocxdef *ctx,char *fn)

{
  int iVar1;
  char *in_RSI;
  uint local_4;
  
  iVar1 = tiologcls((tiocxdef *)0x27f9a7);
  if (iVar1 == 0) {
    strcpy(logfname,in_RSI);
    logfp = (osfildef *)fopen(in_RSI,"w");
    out_init_log((out_stream_info *)0x27f9e9);
    G_log_disp.html_mode = G_std_disp.html_mode;
    local_4 = (uint)(logfp == (osfildef *)0x0);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int tiologopn(tiocxdef *ctx, char *fn)
{
    /* if there's an old log file, close it */
    if (tiologcls(ctx))
        return 1;

    /* save the filename for later */
    strcpy(logfname, fn);

    /* open the new file */
    logfp = osfopwt(fn, OSFTLOG);

    /* 
     *   Reset the log file's output formatter state, since we're opening
     *   a new file.  
     */
    out_init_log(&G_log_disp);

    /* 
     *   Set the log file's HTML source mode flag to the same value as is
     *   currently being used in the main display stream, so that it will
     *   interpret source markups the same way that the display stream is
     *   going to.  
     */
    G_log_disp.html_mode = G_std_disp.html_mode;

    /* return 0 on success, non-zero on failure */
    return (logfp == 0);
}